

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walLockExclusive(Wal *pWal,int lockIdx,int n)

{
  int rc;
  int n_local;
  int lockIdx_local;
  Wal *pWal_local;
  
  if (pWal->exclusiveMode == '\0') {
    pWal_local._4_4_ = sqlite3OsShmLock(pWal->pDbFd,lockIdx,n,10);
  }
  else {
    pWal_local._4_4_ = 0;
  }
  return pWal_local._4_4_;
}

Assistant:

static int walLockExclusive(Wal *pWal, int lockIdx, int n){
  int rc;
  if( pWal->exclusiveMode ) return SQLITE_OK;
  rc = sqlite3OsShmLock(pWal->pDbFd, lockIdx, n,
                        SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE);
  WALTRACE(("WAL%p: acquire EXCLUSIVE-%s cnt=%d %s\n", pWal,
            walLockName(lockIdx), n, rc ? "failed" : "ok"));
  VVA_ONLY( pWal->lockError = (u8)(rc!=SQLITE_OK && rc!=SQLITE_BUSY); )
  return rc;
}